

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenReader.cpp
# Opt level: O2

int __thiscall ninx::parser::TokenReader::check_type(TokenReader *this,Type type)

{
  Type TVar1;
  uint uVar2;
  Token *pTVar3;
  
  pTVar3 = peek_token(this);
  if (pTVar3 == (Token *)0x0) {
    uVar2 = 0xffffffff;
  }
  else {
    TVar1 = (*pTVar3->_vptr_Token[2])(pTVar3);
    uVar2 = (uint)(TVar1 == type);
  }
  return uVar2;
}

Assistant:

int ninx::parser::TokenReader::check_type(Type type) {
    auto token = peek_token();
    if (!token) {
        return -1;
    }

    return token->get_type() == type;
}